

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O1

void mixer_pp_callback(void *buf,uint samples,void *userdata)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  
  if (!saving) {
    return;
  }
  iVar1 = al_get_mixer_channels(userdata);
  if (iVar1 == 0x10) {
    iVar1 = 1;
  }
  else {
    if (iVar1 != 0x20) {
      return;
    }
    iVar1 = 2;
  }
  uVar2 = al_get_mixer_depth(userdata);
  iVar3 = al_get_audio_depth_size(uVar2);
  al_fwrite(save_fp,buf,iVar1 * samples * iVar3);
  return;
}

Assistant:

static void mixer_pp_callback(void *buf, unsigned int samples, void *userdata)
{
   ALLEGRO_MIXER *mixer = (ALLEGRO_MIXER *)userdata;
   int nch;
   int sample_size;

   if (!saving)
      return;

   switch (al_get_mixer_channels(mixer)) {
      case ALLEGRO_CHANNEL_CONF_1:
         nch = 1;
         break;
      case ALLEGRO_CHANNEL_CONF_2:
         nch = 2;
         break;
      default:
         /* Not supported. */
         return;
   }

   sample_size = al_get_audio_depth_size(al_get_mixer_depth(mixer));
   al_fwrite(save_fp, buf, nch * samples * sample_size);
}